

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O1

void core::image::save_tiff_file(ConstPtr *image,string *filename)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  pointer puVar4;
  pointer puVar5;
  long lVar6;
  long lVar7;
  FileException *this;
  Exception *this_00;
  code *pcVar8;
  pointer_____offset_0x10___ *ppuVar9;
  pointer puVar10;
  string local_50;
  
  if ((image->super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr == (element_type *)0x0) {
    this = (FileException *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument((invalid_argument *)this,"Null image given");
    ppuVar9 = (pointer_____offset_0x10___ *)&std::invalid_argument::typeinfo;
    pcVar8 = std::invalid_argument::~invalid_argument;
  }
  else {
    lVar6 = TIFFOpen((filename->_M_dataplus)._M_p,"w");
    if (lVar6 != 0) {
      peVar3 = (image->
               super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      iVar1 = (peVar3->super_TypedImageBase<unsigned_char>).super_ImageBase.h;
      iVar2 = (peVar3->super_TypedImageBase<unsigned_char>).super_ImageBase.c;
      TIFFSetField(lVar6,0x100,(peVar3->super_TypedImageBase<unsigned_char>).super_ImageBase.w);
      TIFFSetField(lVar6,0x101,iVar1);
      TIFFSetField(lVar6,0x115,iVar2);
      TIFFSetField(lVar6,0x102,8);
      TIFFSetField(lVar6,0x103,0x80b2);
      TIFFSetField(lVar6,0x11c,1);
      TIFFSetField(lVar6,0x106,2);
      peVar3 = (image->
               super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      puVar4 = (peVar3->super_TypedImageBase<unsigned_char>).data.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar5 = *(pointer *)
                ((long)&(peVar3->super_TypedImageBase<unsigned_char>).data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data + 8);
      puVar10 = (pointer)0x0;
      if (puVar4 != puVar5) {
        puVar10 = puVar4;
      }
      lVar7 = TIFFWriteEncodedStrip(lVar6,0,puVar10,(long)((int)puVar5 - (int)puVar4));
      TIFFClose(lVar6);
      if (-1 < lVar7) {
        return;
      }
      this_00 = (Exception *)__cxa_allocate_exception(0x28);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Error writing TIFF image","");
      util::Exception::Exception(this_00,&local_50);
      __cxa_throw(this_00,&util::Exception::typeinfo,util::Exception::~Exception);
    }
    this = (FileException *)__cxa_allocate_exception(0x48);
    util::FileException::FileException(this,filename,"Unknown TIFF file error");
    ppuVar9 = &util::FileException::typeinfo;
    pcVar8 = util::FileException::~FileException;
  }
  __cxa_throw(this,ppuVar9,pcVar8);
}

Assistant:

void
save_tiff_file (ByteImage::ConstPtr image, std::string const& filename)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    TIFF* tif = TIFFOpen(filename.c_str(), "w");
    if (!tif)
        throw util::FileException(filename, "Unknown TIFF file error");

    uint32_t width = image->width();
    uint32_t height = image->height();
    uint32_t channels = image->channels();
    TIFFSetField(tif, TIFFTAG_IMAGEWIDTH, width);
    TIFFSetField(tif, TIFFTAG_IMAGELENGTH, height);
    TIFFSetField(tif, TIFFTAG_SAMPLESPERPIXEL, channels);
    TIFFSetField(tif, TIFFTAG_BITSPERSAMPLE, 8);
    TIFFSetField(tif, TIFFTAG_COMPRESSION, COMPRESSION_DEFLATE);
    TIFFSetField(tif, TIFFTAG_PLANARCONFIG, PLANARCONFIG_CONTIG);
    TIFFSetField(tif, TIFFTAG_PHOTOMETRIC, PHOTOMETRIC_RGB);

    tdata_t buffer = const_cast<uint8_t*>(image->get_data_pointer());
    int64_t ret = TIFFWriteEncodedStrip(tif, 0, buffer,
        image->get_value_amount());

    TIFFClose(tif);

    if (ret < 0)
        throw util::Exception("Error writing TIFF image");
}